

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathPositionFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlXPathObjectPtr value;
  int iStack_10;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    if (ctxt->valueNr < ctxt->valueFrame) {
      iStack_10 = 0x17;
    }
    else {
      iVar1 = ctxt->context->proximityPosition;
      if (-1 < iVar1) {
        value = xmlXPathCacheNewFloat(ctxt->context,(double)iVar1);
        valuePush(ctxt,value);
        return;
      }
      iStack_10 = 0xe;
    }
  }
  else {
    iStack_10 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_10);
  return;
}

Assistant:

void
xmlXPathPositionFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(0);
    if (ctxt->context->proximityPosition >= 0) {
	valuePush(ctxt,
	      xmlXPathCacheNewFloat(ctxt->context,
		(double) ctxt->context->proximityPosition));
#ifdef DEBUG_EXPR
	xmlGenericError(xmlGenericErrorContext, "position() : %d\n",
		ctxt->context->proximityPosition);
#endif
    } else {
	XP_ERROR(XPATH_INVALID_CTXT_POSITION);
    }
}